

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceMinLayerParams::InternalSwap
          (ReduceMinLayerParams *this,ReduceMinLayerParams *other)

{
  ReduceMinLayerParams *other_local;
  ReduceMinLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<long>::InternalSwap(&this->axes_,&other->axes_);
  google::protobuf::internal::memswap<2>(&this->keepdims_,&other->keepdims_);
  return;
}

Assistant:

void ReduceMinLayerParams::InternalSwap(ReduceMinLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  axes_.InternalSwap(&other->axes_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ReduceMinLayerParams, reduceall_)
      + sizeof(ReduceMinLayerParams::reduceall_)
      - PROTOBUF_FIELD_OFFSET(ReduceMinLayerParams, keepdims_)>(
          reinterpret_cast<char*>(&keepdims_),
          reinterpret_cast<char*>(&other->keepdims_));
}